

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx::UserGeometryISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,UserGeometryISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  PrimRefMB *pPVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  undefined1 auVar8 [16];
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  size_t itime;
  unsigned_long uVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar29;
  undefined1 auVar28 [16];
  float fVar33;
  float fVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  float fVar37;
  float fVar38;
  undefined1 auVar36 [16];
  float fVar39;
  float fVar41;
  float fVar42;
  undefined1 auVar40 [16];
  float fVar43;
  ulong local_218;
  size_t local_1f8;
  BBox<embree::Vec3fa> bupper1;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  BBox3fa box;
  anon_class_16_2_4e716a3c local_b0;
  ulong local_a0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar19 = r->_begin;
  local_138 = SUB6416(ZEXT464(0x3f800000),0);
  local_128 = ZEXT816(0x3f80000000000000);
  local_218 = 0;
  local_168._8_4_ = 0xff800000;
  local_168._0_8_ = 0xff800000ff800000;
  local_168._12_4_ = 0xff800000;
  local_178._8_4_ = 0x7f800000;
  local_178._0_8_ = 0x7f8000007f800000;
  local_178._12_4_ = 0x7f800000;
  local_148._8_4_ = 0xff800000;
  local_148._0_8_ = 0xff800000ff800000;
  local_148._12_4_ = 0xff800000;
  local_188._8_4_ = 0xff800000;
  local_188._0_8_ = 0xff800000ff800000;
  local_188._12_4_ = 0xff800000;
  local_158._8_4_ = 0x7f800000;
  local_158._0_8_ = 0x7f8000007f800000;
  local_158._12_4_ = 0x7f800000;
  local_1a8._8_4_ = 0x7f800000;
  local_1a8._0_8_ = 0x7f8000007f800000;
  local_1a8._12_4_ = 0x7f800000;
  local_198 = ZEXT816(0);
  local_1f8 = k;
  do {
    if (r->_end <= uVar19) {
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_1a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_1a8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_188._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_188._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        lower.field_0 = local_178._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.lower.field_0 + 8) = local_178._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        upper.field_0 = local_168._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.upper.field_0 + 8) = local_168._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_158._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_158._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_148._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_148._8_8_;
      (__return_storage_ptr__->object_range)._end = local_198._0_8_;
      __return_storage_ptr__->num_time_segments = local_198._8_8_;
      __return_storage_ptr__->max_num_time_segments = local_218;
      auVar32 = vunpcklpd_avx(local_128,local_138);
      (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar32._0_8_;
      (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar32._0_8_ >> 0x20);
      (__return_storage_ptr__->time_range).lower = (float)(int)auVar32._8_8_;
      (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar32._8_8_ >> 0x20);
      return __return_storage_ptr__;
    }
    BVar2 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
    auVar32._8_8_ = 0;
    auVar32._0_4_ = BVar2.lower;
    auVar32._4_4_ = BVar2.upper;
    fVar1 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
    fVar20 = BVar2.lower;
    auVar32 = vmovshdup_avx(auVar32);
    fVar29 = auVar32._0_4_ - fVar20;
    auVar32 = ZEXT416((uint)(fVar1 * ((t0t1->lower - fVar20) / fVar29) * 1.0000002));
    auVar32 = vroundss_avx(auVar32,auVar32,9);
    auVar32 = vmaxss_avx(ZEXT816(0) << 0x40,auVar32);
    auVar22 = ZEXT416((uint)(fVar1 * ((t0t1->upper - fVar20) / fVar29) * 0.99999976));
    auVar22 = vroundss_avx(auVar22,auVar22,10);
    auVar22 = vminss_avx(auVar22,ZEXT416((uint)fVar1));
    uVar17 = (ulong)(int)auVar32._0_4_;
    while (uVar17 <= (ulong)(long)(int)auVar22._0_4_) {
      bupper1.lower.field_0._0_8_ = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr
      ;
      bupper1.lower.field_0.m128[3] = (float)(int)uVar17;
      bupper1.upper.field_0._0_8_ = &box;
      bupper1.lower.field_0.m128[2] = (float)uVar19;
      (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&bupper1);
      auVar8._4_4_ = box.lower.field_0.m128[1];
      auVar8._0_4_ = box.lower.field_0.m128[0];
      auVar8._8_4_ = box.lower.field_0.m128[2];
      auVar8._12_4_ = box.lower.field_0.m128[3];
      auVar12._4_4_ = box.upper.field_0.m128[1];
      auVar12._0_4_ = box.upper.field_0.m128[0];
      auVar12._8_4_ = box.upper.field_0.m128[2];
      auVar12._12_4_ = box.upper.field_0.m128[3];
      auVar26._8_4_ = 0xddccb9a2;
      auVar26._0_8_ = 0xddccb9a2ddccb9a2;
      auVar26._12_4_ = 0xddccb9a2;
      auVar32 = vcmpps_avx(auVar8,auVar26,6);
      auVar27._8_4_ = 0x5dccb9a2;
      auVar27._0_8_ = 0x5dccb9a25dccb9a2;
      auVar27._12_4_ = 0x5dccb9a2;
      auVar26 = vcmpps_avx(auVar12,auVar27,1);
      auVar32 = vandps_avx(auVar26,auVar32);
      auVar26 = vcmpps_avx(auVar8,auVar12,2);
      auVar32 = vandps_avx(auVar32,auVar26);
      uVar13 = vmovmskps_avx(auVar32);
      uVar17 = uVar17 + 1;
      if ((~(byte)uVar13 & 7) != 0) goto LAB_00b95788;
    }
    local_b0.primID = &local_a0;
    fVar1 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
    fVar29 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.lower;
    fVar21 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.upper - fVar29;
    fVar24 = (t0t1->lower - fVar29) / fVar21;
    fVar21 = (t0t1->upper - fVar29) / fVar21;
    fVar29 = fVar1 * fVar24;
    fVar20 = fVar1 * fVar21;
    auVar26 = vroundss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29),9);
    auVar8 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),10);
    auVar32 = vmaxss_avx(auVar26,ZEXT816(0));
    auVar22 = vminss_avx(auVar8,ZEXT416((uint)fVar1));
    uVar16 = (uint)auVar32._0_4_;
    uVar17 = (ulong)uVar16;
    fVar25 = auVar22._0_4_;
    iVar14 = (int)auVar26._0_4_;
    iVar18 = -1;
    if (-1 < iVar14) {
      iVar18 = iVar14;
    }
    iVar9 = (int)fVar1 + 1;
    if ((int)auVar8._0_4_ < (int)fVar1 + 1) {
      iVar9 = (int)auVar8._0_4_;
    }
    local_b0.this = (AccelSet *)this;
    local_a0 = uVar19;
    AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()(&box,&local_b0,(long)(int)uVar16);
    AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
              (&bupper1,&local_b0,(long)(int)fVar25);
    fVar29 = fVar29 - auVar32._0_4_;
    if (iVar9 - iVar18 == 1) {
      auVar32 = vmaxss_avx(ZEXT416((uint)fVar29),ZEXT816(0) << 0x40);
      auVar22 = vshufps_avx(auVar32,auVar32,0);
      auVar32 = ZEXT416((uint)(1.0 - auVar32._0_4_));
      auVar32 = vshufps_avx(auVar32,auVar32,0);
      auVar40._0_4_ =
           auVar22._0_4_ * bupper1.lower.field_0.m128[0] + auVar32._0_4_ * box.lower.field_0.m128[0]
      ;
      auVar40._4_4_ =
           auVar22._4_4_ * bupper1.lower.field_0.m128[1] + auVar32._4_4_ * box.lower.field_0.m128[1]
      ;
      auVar40._8_4_ =
           auVar22._8_4_ * bupper1.lower.field_0.m128[2] + auVar32._8_4_ * box.lower.field_0.m128[2]
      ;
      auVar40._12_4_ =
           auVar22._12_4_ * bupper1.lower.field_0.m128[3] +
           auVar32._12_4_ * box.lower.field_0.m128[3];
      auVar36._0_4_ =
           auVar22._0_4_ * bupper1.upper.field_0.m128[0] + auVar32._0_4_ * box.upper.field_0.m128[0]
      ;
      auVar36._4_4_ =
           auVar22._4_4_ * bupper1.upper.field_0.m128[1] + auVar32._4_4_ * box.upper.field_0.m128[1]
      ;
      auVar36._8_4_ =
           auVar22._8_4_ * bupper1.upper.field_0.m128[2] + auVar32._8_4_ * box.upper.field_0.m128[2]
      ;
      auVar36._12_4_ =
           auVar22._12_4_ * bupper1.upper.field_0.m128[3] +
           auVar32._12_4_ * box.upper.field_0.m128[3];
      auVar32 = vmaxss_avx(ZEXT416((uint)(fVar25 - fVar20)),ZEXT816(0) << 0x40);
      auVar22 = vshufps_avx(auVar32,auVar32,0);
      auVar32 = ZEXT416((uint)(1.0 - auVar32._0_4_));
      auVar32 = vshufps_avx(auVar32,auVar32,0);
      auVar28._0_4_ =
           auVar32._0_4_ * bupper1.lower.field_0.m128[0] + auVar22._0_4_ * box.lower.field_0.m128[0]
      ;
      auVar28._4_4_ =
           auVar32._4_4_ * bupper1.lower.field_0.m128[1] + auVar22._4_4_ * box.lower.field_0.m128[1]
      ;
      auVar28._8_4_ =
           auVar32._8_4_ * bupper1.lower.field_0.m128[2] + auVar22._8_4_ * box.lower.field_0.m128[2]
      ;
      auVar28._12_4_ =
           auVar32._12_4_ * bupper1.lower.field_0.m128[3] +
           auVar22._12_4_ * box.lower.field_0.m128[3];
      auVar30._0_4_ =
           auVar32._0_4_ * bupper1.upper.field_0.m128[0] + auVar22._0_4_ * box.upper.field_0.m128[0]
      ;
      auVar30._4_4_ =
           auVar32._4_4_ * bupper1.upper.field_0.m128[1] + auVar22._4_4_ * box.upper.field_0.m128[1]
      ;
      auVar30._8_4_ =
           auVar32._8_4_ * bupper1.upper.field_0.m128[2] + auVar22._8_4_ * box.upper.field_0.m128[2]
      ;
      auVar30._12_4_ =
           auVar32._12_4_ * bupper1.upper.field_0.m128[3] +
           auVar22._12_4_ * box.upper.field_0.m128[3];
    }
    else {
      AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&blower1,&local_b0,(long)(int)(uVar16 + 1));
      AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&bupper0,&local_b0,(long)((int)fVar25 + -1));
      auVar32 = vmaxss_avx(ZEXT416((uint)fVar29),ZEXT816(0) << 0x40);
      auVar22 = vshufps_avx(auVar32,auVar32,0);
      auVar32 = ZEXT416((uint)(1.0 - auVar32._0_4_));
      auVar32 = vshufps_avx(auVar32,auVar32,0);
      auVar40._0_4_ =
           auVar22._0_4_ * blower1.lower.field_0.m128[0] + auVar32._0_4_ * box.lower.field_0.m128[0]
      ;
      auVar40._4_4_ =
           auVar22._4_4_ * blower1.lower.field_0.m128[1] + auVar32._4_4_ * box.lower.field_0.m128[1]
      ;
      auVar40._8_4_ =
           auVar22._8_4_ * blower1.lower.field_0.m128[2] + auVar32._8_4_ * box.lower.field_0.m128[2]
      ;
      auVar40._12_4_ =
           auVar22._12_4_ * blower1.lower.field_0.m128[3] +
           auVar32._12_4_ * box.lower.field_0.m128[3];
      auVar36._0_4_ =
           auVar22._0_4_ * blower1.upper.field_0.m128[0] + auVar32._0_4_ * box.upper.field_0.m128[0]
      ;
      auVar36._4_4_ =
           auVar22._4_4_ * blower1.upper.field_0.m128[1] + auVar32._4_4_ * box.upper.field_0.m128[1]
      ;
      auVar36._8_4_ =
           auVar22._8_4_ * blower1.upper.field_0.m128[2] + auVar32._8_4_ * box.upper.field_0.m128[2]
      ;
      auVar36._12_4_ =
           auVar22._12_4_ * blower1.upper.field_0.m128[3] +
           auVar32._12_4_ * box.upper.field_0.m128[3];
      auVar32 = vmaxss_avx(ZEXT416((uint)(fVar25 - fVar20)),ZEXT816(0) << 0x40);
      auVar22 = vshufps_avx(auVar32,auVar32,0);
      auVar32 = ZEXT416((uint)(1.0 - auVar32._0_4_));
      auVar32 = vshufps_avx(auVar32,auVar32,0);
      auVar28._0_4_ =
           auVar22._0_4_ * bupper0.lower.field_0.m128[0] +
           auVar32._0_4_ * bupper1.lower.field_0.m128[0];
      auVar28._4_4_ =
           auVar22._4_4_ * bupper0.lower.field_0.m128[1] +
           auVar32._4_4_ * bupper1.lower.field_0.m128[1];
      auVar28._8_4_ =
           auVar22._8_4_ * bupper0.lower.field_0.m128[2] +
           auVar32._8_4_ * bupper1.lower.field_0.m128[2];
      auVar28._12_4_ =
           auVar22._12_4_ * bupper0.lower.field_0.m128[3] +
           auVar32._12_4_ * bupper1.lower.field_0.m128[3];
      auVar30._0_4_ =
           auVar22._0_4_ * bupper0.upper.field_0.m128[0] +
           auVar32._0_4_ * bupper1.upper.field_0.m128[0];
      auVar30._4_4_ =
           auVar22._4_4_ * bupper0.upper.field_0.m128[1] +
           auVar32._4_4_ * bupper1.upper.field_0.m128[1];
      auVar30._8_4_ =
           auVar22._8_4_ * bupper0.upper.field_0.m128[2] +
           auVar32._8_4_ * bupper1.upper.field_0.m128[2];
      auVar30._12_4_ =
           auVar22._12_4_ * bupper0.upper.field_0.m128[3] +
           auVar32._12_4_ * bupper1.upper.field_0.m128[3];
      if (iVar14 < 0) {
        iVar14 = -1;
      }
      itime = (size_t)iVar14;
      while (itime = itime + 1, (long)itime < (long)iVar9) {
        auVar22._0_4_ = ((float)(int)itime / fVar1 - fVar24) / (fVar21 - fVar24);
        auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar32 = vshufps_avx(auVar22,auVar22,0);
        fVar29 = auVar28._4_4_;
        fVar20 = auVar28._8_4_;
        fVar25 = auVar28._12_4_;
        auVar22 = vshufps_avx(ZEXT416((uint)(1.0 - auVar22._0_4_)),
                              ZEXT416((uint)(1.0 - auVar22._0_4_)),0);
        fVar41 = auVar40._4_4_;
        fVar42 = auVar40._8_4_;
        fVar43 = auVar40._12_4_;
        fVar33 = auVar30._4_4_;
        fVar34 = auVar30._8_4_;
        fVar35 = auVar30._12_4_;
        fVar37 = auVar36._4_4_;
        fVar38 = auVar36._8_4_;
        fVar39 = auVar36._12_4_;
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_b0,itime);
        auVar11._4_4_ = fVar29 * auVar32._4_4_ + fVar41 * auVar22._4_4_;
        auVar11._0_4_ = auVar28._0_4_ * auVar32._0_4_ + auVar40._0_4_ * auVar22._0_4_;
        auVar11._8_4_ = fVar20 * auVar32._8_4_ + fVar42 * auVar22._8_4_;
        auVar11._12_4_ = fVar25 * auVar32._12_4_ + fVar43 * auVar22._12_4_;
        auVar26 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar11);
        auVar10._4_4_ = fVar33 * auVar32._4_4_ + fVar37 * auVar22._4_4_;
        auVar10._0_4_ = auVar30._0_4_ * auVar32._0_4_ + auVar36._0_4_ * auVar22._0_4_;
        auVar10._8_4_ = fVar34 * auVar32._8_4_ + fVar38 * auVar22._8_4_;
        auVar10._12_4_ = fVar35 * auVar32._12_4_ + fVar39 * auVar22._12_4_;
        auVar32 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar10);
        auVar22 = vminps_avx(auVar26,ZEXT816(0) << 0x40);
        auVar32 = vmaxps_avx(auVar32,ZEXT816(0) << 0x40);
        auVar40._0_4_ = auVar40._0_4_ + auVar22._0_4_;
        auVar40._4_4_ = fVar41 + auVar22._4_4_;
        auVar40._8_4_ = fVar42 + auVar22._8_4_;
        auVar40._12_4_ = fVar43 + auVar22._12_4_;
        auVar28._0_4_ = auVar28._0_4_ + auVar22._0_4_;
        auVar28._4_4_ = fVar29 + auVar22._4_4_;
        auVar28._8_4_ = fVar20 + auVar22._8_4_;
        auVar28._12_4_ = fVar25 + auVar22._12_4_;
        auVar36._0_4_ = auVar36._0_4_ + auVar32._0_4_;
        auVar36._4_4_ = fVar37 + auVar32._4_4_;
        auVar36._8_4_ = fVar38 + auVar32._8_4_;
        auVar36._12_4_ = fVar39 + auVar32._12_4_;
        auVar30._0_4_ = auVar30._0_4_ + auVar32._0_4_;
        auVar30._4_4_ = fVar33 + auVar32._4_4_;
        auVar30._8_4_ = fVar34 + auVar32._8_4_;
        auVar30._12_4_ = fVar35 + auVar32._12_4_;
      }
    }
    aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar40,ZEXT416(geomID),0x30);
    uVar16 = (this->super_UserGeometry).super_AccelSet.super_Geometry.numTimeSteps - 1;
    uVar15 = (ulong)uVar16;
    BVar2 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
    auVar23._8_8_ = 0;
    auVar23._0_4_ = BVar2.lower;
    auVar23._4_4_ = BVar2.upper;
    aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar36,ZEXT416((uint)(float)uVar19),0x30);
    aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar28,ZEXT416(uVar16),0x30);
    aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar30,ZEXT416(uVar16),0x30);
    auVar22 = vcmpps_avx(local_138,auVar23,1);
    auVar26 = vinsertps_avx(local_138,auVar23,0x50);
    auVar32 = vblendps_avx(auVar23,local_138,2);
    local_138 = vblendvps_avx(auVar32,auVar26,auVar22);
    auVar31._0_4_ = aVar4.x * 0.5 + aVar6.x * 0.5 + aVar5.x * 0.5 + aVar7.x * 0.5;
    auVar31._4_4_ = aVar4.y * 0.5 + aVar6.y * 0.5 + aVar5.y * 0.5 + aVar7.y * 0.5;
    auVar31._8_4_ = aVar4.z * 0.5 + aVar6.z * 0.5 + aVar5.z * 0.5 + aVar7.z * 0.5;
    auVar31._12_4_ =
         aVar4.field_3.w * 0.5 + aVar6.field_3.w * 0.5 +
         aVar5.field_3.w * 0.5 + aVar7.field_3.w * 0.5;
    local_158 = vminps_avx(local_158,auVar31);
    local_148 = vmaxps_avx(local_148,auVar31);
    auVar32 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar17 >> 8),local_218 < uVar15)),0x50);
    auVar32 = vpslld_avx(auVar32,0x1f);
    local_128 = vblendvps_avx(local_128,auVar23,auVar32);
    auVar32 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar32 = vpinsrq_avx(auVar32,uVar15,1);
    local_198 = vpaddq_avx(local_198,auVar32);
    if (local_218 <= uVar15) {
      local_218 = uVar15;
    }
    local_1a8 = vminps_avx(local_1a8,(undefined1  [16])aVar4);
    pPVar3 = prims->items;
    pPVar3[local_1f8].lbounds.bounds0.lower.field_0.field_1 = aVar4;
    local_188 = vmaxps_avx(local_188,(undefined1  [16])aVar5);
    pPVar3[local_1f8].lbounds.bounds0.upper.field_0.field_1 = aVar5;
    local_178 = vminps_avx(local_178,(undefined1  [16])aVar6);
    pPVar3[local_1f8].lbounds.bounds1.lower.field_0.field_1 = aVar6;
    local_168 = vmaxps_avx(local_168,(undefined1  [16])aVar7);
    pPVar3[local_1f8].lbounds.bounds1.upper.field_0.field_1 = aVar7;
    pPVar3[local_1f8].time_range = BVar2;
    local_1f8 = local_1f8 + 1;
LAB_00b95788:
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }